

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

token * __thiscall
mjs::parser::expect(token *__return_storage_ptr__,parser *this,token_type tt,char *func,int line)

{
  ostream *poVar1;
  runtime_error *this_00;
  undefined4 in_register_00000014;
  ostringstream oss;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  accept((parser *)__return_storage_ptr__,(int)this,(sockaddr *)CONCAT44(in_register_00000014,tt),
         (socklen_t *)func);
  if (__return_storage_ptr__->type_ != eof) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Expected ",9);
  poVar1 = mjs::operator<<((ostream *)local_1a0,tt);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," in ",4);
  poVar1 = std::operator<<(poVar1,func);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," line ",6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," got ",5);
  mjs::operator<<(poVar1,&this->current_token_);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

token expect(token_type tt, const char* func, int line) {
        auto t = accept(tt);
        if (!t) {
            std::ostringstream oss;
            oss << "Expected " << tt << " in " << func << " line " << line << " got " << current_token();
            throw std::runtime_error(oss.str());
        }
        return t;
    }